

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSSerializerImpl.cpp
# Opt level: O2

ssize_t __thiscall
xercesc_4_0::DOMLSSerializerImpl::write(DOMLSSerializerImpl *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  int iVar2;
  LocalFileFormatTarget *target;
  LocalFileFormatTarget *this_00;
  DOMNode *pDVar3;
  XMLCh *pXVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLCh *pXVar5;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  XMLFormatter *this_01;
  ulong uVar6;
  undefined4 in_register_00000034;
  DOMNode *nodeToWrite;
  Janitor<xercesc_4_0::XMLFormatter> janName;
  undefined4 extraout_var;
  
  nodeToWrite = (DOMNode *)CONCAT44(in_register_00000034,__fd);
  pDVar3 = nodeToWrite;
  target = (LocalFileFormatTarget *)(**(code **)(*__buf + 0x10))(__buf);
  if (target == (LocalFileFormatTarget *)0x0) {
    pXVar4 = (XMLCh *)(**(code **)(*__buf + 0x20))(__buf);
    if (pXVar4 == (XMLCh *)0x0) {
      uVar6 = 0;
      goto LAB_0028bc3d;
    }
    this_00 = (LocalFileFormatTarget *)XMemory::operator_new((XMemory *)0x30,(size_t)pDVar3);
    LocalFileFormatTarget::LocalFileFormatTarget(this_00,pXVar4,this->fMemoryManager);
    target = this_00;
  }
  else {
    this_00 = (LocalFileFormatTarget *)0x0;
  }
  this->fEncodingUsed = (XMLCh *)gUTF8;
  iVar2 = (*nodeToWrite->_vptr_DOMNode[4])(nodeToWrite);
  if (iVar2 == 9) {
    pDVar3 = nodeToWrite + -3;
  }
  else {
    iVar2 = (*nodeToWrite->_vptr_DOMNode[0xc])(nodeToWrite);
    pDVar3 = (DOMNode *)CONCAT44(extraout_var,iVar2);
  }
  pXVar4 = (XMLCh *)(**(code **)(*__buf + 0x18))(__buf);
  if ((pXVar4 == (XMLCh *)0x0) || (*pXVar4 == L'\0')) {
    if (pDVar3 != (DOMNode *)0x0) {
      iVar2 = (*pDVar3->_vptr_DOMNode[0x14])(pDVar3);
      pXVar4 = (XMLCh *)CONCAT44(extraout_var_00,iVar2);
      if ((pXVar4 == (XMLCh *)0x0) || (*pXVar4 == L'\0')) {
        iVar2 = (*pDVar3->_vptr_DOMNode[0x15])(pDVar3);
        pXVar4 = (XMLCh *)CONCAT44(extraout_var_01,iVar2);
        if ((pXVar4 == (XMLCh *)0x0) || (*pXVar4 == L'\0')) goto LAB_0028bb38;
      }
      goto LAB_0028bb34;
    }
  }
  else {
LAB_0028bb34:
    this->fEncodingUsed = pXVar4;
  }
LAB_0028bb38:
  pXVar4 = this->fNewLine;
  if (pXVar4 == (XMLCh *)0x0) {
    pXVar5 = L"\n";
  }
  else {
    pXVar5 = L"\n";
    if (*pXVar4 != L'\0') {
      pXVar5 = pXVar4;
    }
  }
  this->fNewLineUsed = pXVar5;
  pXVar4 = L"1.0";
  if (((pDVar3 != (DOMNode *)0x0) &&
      (iVar2 = (*pDVar3->_vptr_DOMNode[0x18])(pDVar3), CONCAT44(extraout_var_02,iVar2) != 0)) &&
     (iVar2 = (*pDVar3->_vptr_DOMNode[0x18])(pDVar3), *(short *)CONCAT44(extraout_var_03,iVar2) != 0
     )) {
    iVar2 = (*pDVar3->_vptr_DOMNode[0x18])(pDVar3);
    pXVar4 = (XMLCh *)CONCAT44(extraout_var_04,iVar2);
  }
  this->fDocumentVersion = pXVar4;
  bVar1 = XMLString::equals(pXVar4,L"1.1");
  this->fIsXml11 = bVar1;
  this->fErrorCount = 0;
  this->fLineFeedInTextNodePrinted = false;
  this->fLastWhiteSpaceInTextNode = 0;
  this_01 = (XMLFormatter *)XMemory::operator_new(0x4090,this->fMemoryManager);
  XMLFormatter::XMLFormatter
            (this_01,this->fEncodingUsed,this->fDocumentVersion,&target->super_XMLFormatTarget,
             NoEscapes,UnRep_CharRef,this->fMemoryManager);
  this->fFormatter = this_01;
  janName.fData = this_01;
  processNode(this,nodeToWrite);
  (*(target->super_XMLFormatTarget)._vptr_XMLFormatTarget[3])(target);
  Janitor<xercesc_4_0::XMLFormatter>::~Janitor(&janName);
  uVar6 = CONCAT71((int7)((ulong)this_01 >> 8),this->fErrorCount == 0);
  if (this_00 != (LocalFileFormatTarget *)0x0) {
    (*(this_00->super_XMLFormatTarget)._vptr_XMLFormatTarget[1])(this_00);
  }
LAB_0028bc3d:
  return uVar6 & 0xffffffff;
}

Assistant:

bool DOMLSSerializerImpl::write(const DOMNode* nodeToWrite,
                                DOMLSOutput* const destination)
{
    XMLFormatTarget* pTarget=destination->getByteStream();
    Janitor<XMLFormatTarget> janTarget(0);
    if(!pTarget)
    {
        const XMLCh* szSystemId=destination->getSystemId();
        if(!szSystemId)
        {
            //TODO: report error "missing target"
            return false;
        }
        pTarget=new LocalFileFormatTarget(szSystemId, fMemoryManager);
        janTarget.reset(pTarget);
    }
    /**
     * When writing to a LSOutput, the encoding is found by looking at the encoding information
     * that is reachable through the LSOutput and the item to be written (or its owner document) in this order:
     *
     *  1. LSOutput.encoding,
     *  2. Document.inputEncoding,
     *  3. Document.xmlEncoding.
     *
     * If no encoding is reachable through the above properties, a default encoding of "UTF-8" will be used.
     * If the specified encoding is not supported an "unsupported-encoding" fatal error is raised.
     */
    fEncodingUsed = gUTF8;

    const DOMDocument *docu = (nodeToWrite->getNodeType() == DOMNode::DOCUMENT_NODE)?
                              (const DOMDocument*)nodeToWrite : nodeToWrite->getOwnerDocument();

    const XMLCh* lsEncoding=destination->getEncoding();
    if (lsEncoding && *lsEncoding)
    {
        fEncodingUsed = lsEncoding;
    }
    else if (docu)
    {
        const XMLCh* tmpEncoding = docu->getInputEncoding();

        if ( tmpEncoding && *tmpEncoding)
        {
            fEncodingUsed = tmpEncoding;
        }
        else
        {
            tmpEncoding = docu->getXmlEncoding();

            if ( tmpEncoding && *tmpEncoding)
            {
                fEncodingUsed = tmpEncoding;
            }
        }
    }


    /**
     *  The end-of-line sequence of characters to be used in the XML being
     *  written out. The only permitted values are these:
     *     . null
     *
     *  Use a default end-of-line sequence. DOM implementations should choose
     * the default to match the usual convention for text files in the
     * environment being used. Implementations must choose a default
     * sequence that matches one of those allowed by  2.11 "End-of-Line
     * Handling".
     *
     *    CR    The carriage-return character (#xD)
     *    CR-LF The carriage-return and line-feed characters (#xD #xA)
     *    LF    The line-feed character (#xA)
     *
     *  The default value for this attribute is null
     */
    fNewLineUsed = (fNewLine && *fNewLine)? fNewLine : gEOLSeq;

    /**
     *  get Document Version
     */
    fDocumentVersion = (docu && docu->getXmlVersion() && *(docu->getXmlVersion()))?docu->getXmlVersion():XMLUni::fgVersion1_0;
    fIsXml11 = XMLString::equals(fDocumentVersion, XMLUni::fgVersion1_1);

    fErrorCount = 0;

    fLineFeedInTextNodePrinted = false;
    fLastWhiteSpaceInTextNode = 0;

    try
    {
        fFormatter = new (fMemoryManager) XMLFormatter( fEncodingUsed
                                                       ,fDocumentVersion
                                                       ,pTarget
                                                       ,XMLFormatter::NoEscapes
                                                       ,XMLFormatter::UnRep_CharRef
                                                       ,fMemoryManager);
    }
    catch (const TranscodingException& e)
    {
        reportError(nodeToWrite, DOMError::DOM_SEVERITY_FATAL_ERROR, e.getMessage());
        return false;
    }

    try
    {
        Janitor<XMLFormatter> janName(fFormatter);
        processNode(nodeToWrite);
        pTarget->flush();
    }

    //
    // The serialize engine (processNode) throws an exception to abort
    // serialization if
    //
    //   . A fatal error occurs which renders the output ill-formed, or
    //   . Instructed by the application's error handler
    //
    catch (const TranscodingException&)
    {
        pTarget->flush();
        return false;
    }

    catch (const XMLDOMMsg::Codes)
    {
        pTarget->flush();
        return false;
    }
    catch(const OutOfMemoryException&)
    {
        throw;
    }
    catch (...)
    {
        pTarget->flush();
        throw;
    }

    //
    // true if node was successfully serialized and
    // false in case a failure occured and the
    // failure wasn't canceled by the error handler.
    //
    return ((fErrorCount == 0)? true : false);
}